

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeTBLInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t Address_02;
  uint uVar2;
  uint RegNo;
  
  uVar2 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  DVar1 = DecodeDPRRegisterClass(Inst,uVar2,Address,Decoder);
  if (((DVar1 | 2) == MCDisassembler_Success) &&
     ((((Insn & 0x40) == 0 ||
       (DVar1 = DecodeDPRRegisterClass(Inst,uVar2,Address_00,Decoder),
       DVar1 == MCDisassembler_Success)) || (DVar1 == MCDisassembler_SoftFail)))) {
    RegNo = Insn >> 3 & 0x10 | Insn >> 0x10 & 0xf;
    uVar2 = MCInst_getOpcode(Inst);
    if ((uVar2 == 0x8a9) || (uVar2 == 0x8a3)) {
      DVar1 = DecodeDPairRegisterClass(Inst,RegNo,Address_01,Decoder);
      Address_02 = extraout_RDX;
    }
    else {
      DVar1 = DecodeDPRRegisterClass(Inst,RegNo,Address_01,Decoder);
      Address_02 = extraout_RDX_00;
    }
    if ((DVar1 == MCDisassembler_Success) || (DVar1 == MCDisassembler_SoftFail)) {
      DVar1 = DecodeDPRRegisterClass(Inst,Insn >> 1 & 0x10 | Insn & 0xf,Address_02,Decoder);
      DVar1 = (*(code *)(&DAT_001cb1a0 + *(int *)(&DAT_001cb1a0 + (ulong)DVar1 * 4)))();
      return DVar1;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeTBLInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, op;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 7, 1) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	Rm |= fieldFromInstruction_4(Insn, 5, 1) << 4;
	op = fieldFromInstruction_4(Insn, 6, 1);

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (op) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail; // Writeback
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VTBL2:
		case ARM_VTBX2:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}